

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

void des_xmlNodePtr(int no,xmlNodePtr val,int nr)

{
  if (no == 1) {
    free_api_doc();
    return;
  }
  if (val != (xmlNodePtr)0x0) {
    xmlUnlinkNode(val);
    xmlFreeNode(val);
    return;
  }
  return;
}

Assistant:

static void des_xmlNodePtr(int no, xmlNodePtr val, int nr ATTRIBUTE_UNUSED) {
    if (no == 1) {
        free_api_doc();
    } else if (val != NULL) {
        xmlUnlinkNode(val);
        xmlFreeNode(val);
    }
}